

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::AssignmentTypeVisitor::visit(AssignmentTypeVisitor *this,AssignStmt *stmt)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  AssignmentType AVar2;
  Var **ppVVar3;
  AssignmentType type;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  undefined1 auVar4 [12];
  allocator<const_kratos::IRNode_*> local_159;
  Var *local_158;
  Var *local_150;
  Var **local_148;
  size_type local_140;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_138;
  string local_120;
  string local_f0;
  string local_d0;
  Generator *local_b0;
  Generator *parent;
  AssignStmt *stmt_local;
  AssignmentTypeVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  parent = (Generator *)stmt;
  stmt_local = (AssignStmt *)this;
  local_b0 = Stmt::generator_parent(&stmt->super_Stmt);
  if ((local_b0 == (Generator *)0x0) ||
     ((bVar1 = Generator::is_cloned(local_b0), !bVar1 &&
      (bVar1 = Generator::external(local_b0), !bVar1)))) {
    AVar2 = AssignStmt::assign_type((AssignStmt *)parent);
    if (AVar2 == Undefined) {
      AssignStmt::set_assign_type((AssignStmt *)parent,this->type_);
    }
    else if (((this->check_type_ & 1U) != 0) &&
            (AVar2 = AssignStmt::assign_type((AssignStmt *)parent), AVar2 != this->type_)) {
      auVar4 = __cxa_allocate_exception(0x10);
      assign_type_to_str_abi_cxx11_(&local_f0,(kratos *)(ulong)this->type_,auVar4._8_4_);
      AVar2 = AssignStmt::assign_type((AssignStmt *)parent);
      assign_type_to_str_abi_cxx11_(&local_120,(kratos *)(ulong)AVar2,type);
      local_38 = &local_d0;
      local_40 = "mismatch in assignment type. should be {0}, got {1}";
      local_48 = &local_f0;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_120;
      fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[52],char>
                (&local_78,(v7 *)"mismatch in assignment type. should be {0}, got {1}",
                 (char (*) [52])local_48,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
      local_58 = &local_78;
      local_88 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_58;
      local_20 = local_58;
      local_10 = local_58;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_58);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_90.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_88.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)local_88.data_,format_str,args);
      ppVVar3 = AssignStmt::left((AssignStmt *)parent);
      local_158 = *ppVVar3;
      ppVVar3 = AssignStmt::right((AssignStmt *)parent);
      local_150 = *ppVVar3;
      local_148 = &local_158;
      local_140 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_159);
      __l._M_len = local_140;
      __l._M_array = (iterator)local_148;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_138,__l,&local_159);
      VarException::VarException(auVar4._0_8_,&local_d0,&local_138);
      __cxa_throw(auVar4._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
  }
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        auto* parent = stmt->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        if (stmt->assign_type() == AssignmentType::Undefined) {
            stmt->set_assign_type(type_);
        } else if (check_type_ && stmt->assign_type() != type_) {
            throw VarException(
                ::format("mismatch in assignment type. should be {0}, got {1}",
                         assign_type_to_str(type_), assign_type_to_str(stmt->assign_type())),
                {stmt->left(), stmt->right()});
        }
    }